

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

void fetchleaves(cbtDbvt *pdbvt,cbtDbvtNode *root,tNodeArray *leaves,int depth)

{
  cbtDbvtNode *local_28;
  
  local_28 = root;
  if ((depth != 0) && ((root->field_2).childs[1] != (cbtDbvtNode *)0x0)) {
    fetchleaves(pdbvt,(root->field_2).childs[0],leaves,depth + -1);
    fetchleaves(pdbvt,(root->field_2).childs[1],leaves,depth + -1);
    deletenode(pdbvt,root);
    return;
  }
  cbtAlignedObjectArray<cbtDbvtNode_*>::push_back(leaves,&local_28);
  return;
}

Assistant:

static void fetchleaves(cbtDbvt* pdbvt,
						cbtDbvtNode* root,
						tNodeArray& leaves,
						int depth = -1)
{
	if (root->isinternal() && depth)
	{
		fetchleaves(pdbvt, root->childs[0], leaves, depth - 1);
		fetchleaves(pdbvt, root->childs[1], leaves, depth - 1);
		deletenode(pdbvt, root);
	}
	else
	{
		leaves.push_back(root);
	}
}